

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readCStyleComment(Reader *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = this->current_;
  do {
    pcVar3 = pcVar2;
    if (pcVar2 == this->end_) break;
    pcVar3 = pcVar2 + 1;
    this->current_ = pcVar3;
    cVar1 = *pcVar2;
    pcVar2 = pcVar3;
  } while ((cVar1 != '*') || (*pcVar3 != '/'));
  if (pcVar3 != this->end_) {
    this->current_ = pcVar3 + 1;
    return *pcVar3 == '/';
  }
  return false;
}

Assistant:

bool 
Reader::readCStyleComment()
{
   while ( current_ != end_ )
   {
      Char c = getNextChar();
      if ( c == '*'  &&  *current_ == '/' )
         break;
   }
   return getNextChar() == '/';
}